

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_resolver.cpp
# Opt level: O0

int __thiscall
zmq::ip_resolver_t::resolve_nic_name(ip_resolver_t *this,ip_addr_t *ip_addr_,char *nic_)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  short sVar7;
  char *in_RDX;
  size_t __n;
  void *in_RSI;
  long in_RDI;
  int family;
  ifaddrs *ifp;
  bool found;
  char *errstr;
  int i;
  int backoff_msec;
  int max_attempts;
  int rc;
  ifaddrs *ifa;
  undefined8 *local_50;
  int local_38;
  int local_2c;
  undefined8 *local_28;
  char *local_20;
  void *local_18;
  int local_4;
  
  local_28 = (undefined8 *)0x0;
  local_2c = 0;
  local_38 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  while (((local_38 < 10 && (local_2c = getifaddrs(&local_28), local_2c != 0)) &&
         ((-1 < local_2c || (piVar5 = __errno_location(), *piVar5 == 0x6f))))) {
    usleep((1 << ((byte)local_38 & 0x1f)) * 1000);
    local_38 = local_38 + 1;
  }
  if ((local_2c == 0) ||
     ((piVar5 = __errno_location(), *piVar5 != 0x16 &&
      (piVar5 = __errno_location(), *piVar5 != 0x5f)))) {
    if (local_2c != 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip_resolver.cpp"
              ,0x21e);
      fflush(_stderr);
      zmq_abort((char *)0x222801);
    }
    if (local_28 == (undefined8 *)0x0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ifa != NULL",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip_resolver.cpp"
              ,0x21f);
      fflush(_stderr);
      zmq_abort((char *)0x22285d);
    }
    bVar2 = false;
    for (local_50 = local_28; local_50 != (undefined8 *)0x0; local_50 = (undefined8 *)*local_50) {
      if (local_50[3] != 0) {
        sVar1 = *(short *)local_50[3];
        bVar3 = ip_resolver_options_t::ipv6((ip_resolver_options_t *)(in_RDI + 8));
        sVar7 = 2;
        if (bVar3) {
          sVar7 = 10;
        }
        if ((sVar1 == sVar7) && (iVar4 = strcmp(local_20,(char *)local_50[1]), iVar4 == 0)) {
          __n = 0x1c;
          if (sVar1 == 2) {
            __n = 0x10;
          }
          memcpy(local_18,(void *)local_50[3],__n);
          bVar2 = true;
          break;
        }
      }
    }
    freeifaddrs(local_28);
    if (bVar2) {
      local_4 = 0;
    }
    else {
      piVar5 = __errno_location();
      *piVar5 = 0x13;
      local_4 = -1;
    }
  }
  else {
    piVar5 = __errno_location();
    *piVar5 = 0x13;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int zmq::ip_resolver_t::resolve_nic_name (ip_addr_t *ip_addr_, const char *nic_)
{
    //  Get the addresses.
    ifaddrs *ifa = NULL;
    int rc = 0;
    const int max_attempts = 10;
    const int backoff_msec = 1;
    for (int i = 0; i < max_attempts; i++) {
        rc = getifaddrs (&ifa);
        if (rc == 0 || (rc < 0 && errno != ECONNREFUSED))
            break;
        usleep ((backoff_msec << i) * 1000);
    }

    if (rc != 0 && ((errno == EINVAL) || (errno == EOPNOTSUPP))) {
        // Windows Subsystem for Linux compatibility
        errno = ENODEV;
        return -1;
    }
    errno_assert (rc == 0);
    zmq_assert (ifa != NULL);

    //  Find the corresponding network interface.
    bool found = false;
    for (const ifaddrs *ifp = ifa; ifp != NULL; ifp = ifp->ifa_next) {
        if (ifp->ifa_addr == NULL)
            continue;

        const int family = ifp->ifa_addr->sa_family;
        if (family == (_options.ipv6 () ? AF_INET6 : AF_INET)
            && !strcmp (nic_, ifp->ifa_name)) {
            memcpy (ip_addr_, ifp->ifa_addr,
                    (family == AF_INET) ? sizeof (struct sockaddr_in)
                                        : sizeof (struct sockaddr_in6));
            found = true;
            break;
        }
    }

    //  Clean-up;
    freeifaddrs (ifa);

    if (!found) {
        errno = ENODEV;
        return -1;
    }
    return 0;
}